

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_Utf8Dfa.h
# Opt level: O3

void __thiscall
axl::enc::Utf8Dfa::
emitPendingCus<axl::enc::Convert<axl::enc::Utf16s,axl::enc::Utf8,axl::sl::Nop<wchar_t,wchar_t>,axl::enc::Utf8Decoder>::EncodingEmitter_s>
          (Utf8Dfa *this,EncodingEmitter_s *emitter,utf8_t *p)

{
  uint_t uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  uint *puVar6;
  ushort uVar7;
  int iVar8;
  undefined2 uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  
  uVar1 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_state;
  uVar3 = DAT_001530b0;
  uVar4 = (uint)DAT_001530a0;
  switch(uVar1 << 0x1d | uVar1 - 0x10 >> 3) {
  case 0:
  case 1:
    puVar5 = (uint *)(emitter->super_EncodingEmitter_u).m_p;
    uVar2 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp | 0xc0;
    do {
      uVar11 = uVar2;
      if (0xffff < uVar11) goto LAB_0014795d;
      uVar2 = 0xfffd;
    } while ((uVar11 & 0xf800) == 0xd800);
    break;
  case 2:
  case 3:
    puVar5 = (uint *)(emitter->super_EncodingEmitter_u).m_p;
    uVar2 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp | 0xe0;
    do {
      uVar11 = uVar2;
      if (0xffff < uVar11) goto LAB_0014795d;
      uVar2 = 0xfffd;
    } while ((uVar11 & 0xf800) == 0xd800);
    break;
  case 4:
    iVar8 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp;
    puVar6 = (uint *)(emitter->super_EncodingEmitter_u).m_p;
    uVar2 = iVar8 >> 6 | 0xe0;
    do {
      uVar11 = uVar2;
      if (0xffff < uVar11) goto LAB_00147a02;
      uVar2 = 0xfffd;
    } while ((uVar11 & 0xf800) == 0xd800);
    goto LAB_001479f8;
  default:
    goto switchD_001478cf_caseD_5;
  case 6:
  case 7:
    puVar5 = (uint *)(emitter->super_EncodingEmitter_u).m_p;
    uVar2 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp | 0xf0;
    do {
      uVar11 = uVar2;
      if (0xffff < uVar11) goto LAB_0014795d;
      uVar2 = 0xfffd;
    } while ((uVar11 & 0xf800) == 0xd800);
    break;
  case 8:
    iVar8 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp;
    puVar6 = (uint *)(emitter->super_EncodingEmitter_u).m_p;
    uVar2 = iVar8 >> 6 | 0xf0;
    do {
      uVar11 = uVar2;
      if (0xffff < uVar11) goto LAB_00147a02;
      uVar2 = 0xfffd;
    } while ((uVar11 & 0xf800) == 0xd800);
LAB_001479f8:
    uVar7 = (ushort)iVar8;
    *(short *)puVar6 = (short)uVar11;
    lVar10 = 2;
LAB_00147a2d:
    puVar5 = (uint *)((ushort *)((long)puVar6 + lVar10) + 1);
    *(ushort *)((long)puVar6 + lVar10) = uVar7 & 0x3f | 0x80;
    goto LAB_00147ada;
  case 10:
    uVar2 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp;
    uVar11 = (int)uVar2 >> 0xc | 0xf0;
    puVar6 = (uint *)(emitter->super_EncodingEmitter_u).m_p;
    do {
      uVar9 = (undefined2)uVar11;
      if (0xffff < uVar11) {
        *puVar6 = (uVar11 + 0xf0000 >> 10 & 0xffff | uVar11 << 0x10) & uVar4 | uVar3;
        lVar10 = 4;
        goto LAB_00147aae;
      }
      uVar12 = uVar11 & 0xf800;
      uVar11 = 0xfffd;
    } while (uVar12 == 0xd800);
    *(undefined2 *)puVar6 = uVar9;
    lVar10 = 2;
LAB_00147aae:
    puVar5 = (uint *)((long)puVar6 + lVar10) + 1;
    *(uint *)((long)puVar6 + lVar10) =
         ((uVar2 & 0xffff) >> 6 | uVar2 << 0x10) & (uint)DAT_001530c0 | (uint)DAT_001530d0;
    goto LAB_00147ada;
  }
  *(short *)puVar5 = (short)uVar11;
  lVar10 = 2;
LAB_00147988:
  puVar5 = (uint *)((long)puVar5 + lVar10);
LAB_00147ada:
  (emitter->super_EncodingEmitter_u).m_p = (DstUnit *)puVar5;
switchD_001478cf_caseD_5:
  return;
LAB_00147a02:
  uVar7 = (ushort)iVar8;
  *puVar6 = (uVar11 + 0xf0000 >> 10 & 0xffff | uVar11 << 0x10) & uVar4 | uVar3;
  lVar10 = 4;
  goto LAB_00147a2d;
LAB_0014795d:
  *puVar5 = (uVar11 + 0xf0000 >> 10 & 0xffff | uVar11 << 0x10) & uVar4 | uVar3;
  lVar10 = 4;
  goto LAB_00147988;
}

Assistant:

void
	emitPendingCus(
		Emitter& emitter,
		const utf8_t* p
	) {
		switch (m_state) {
		case State_1_2:
		case State_1_2_Error:
			emitter.emitCu(p, 0xc0 | m_cp);
			break;

		case State_1_3:
		case State_1_3_Error:
			emitter.emitCu(p, 0xe0 | m_cp);
			break;

		case State_2_3:
			emitter.emitCu(p - 1, 0xe0 | (m_cp >> 6));
			emitter.emitCu(p, 0x80 | (m_cp & 0x3f));
			break;

		case State_1_4:
		case State_1_4_Error:
			emitter.emitCu(p, 0xf0 | m_cp);
			break;

		case State_2_4:
			emitter.emitCu(p - 1, 0xf0 | (m_cp >> 6));
			emitter.emitCu(p, 0x80 | (m_cp & 0x3f));
			break;

		case State_3_4:
			emitter.emitCu(p - 2, 0xf0 | (m_cp >> 12));
			emitter.emitCu(p - 1, 0x80 | ((m_cp >> 6) & 0x3f));
			emitter.emitCu(p, 0x80 | (m_cp & 0x3f));
			break;
		}
	}